

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

Interpolations *
testing::internal::ValidateMatcherDescription
          (Interpolations *__return_storage_ptr__,char **param_names,char *description)

{
  pointer *ppIVar1;
  char cVar2;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  String *in_RCX;
  ostream *poVar8;
  String *description_00;
  char *p;
  string param_name;
  AssertionResult gtest_ar;
  AssertHelper local_98;
  String *local_90;
  string local_88;
  string local_68;
  vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  *local_48;
  AssertHelper local_40;
  char **local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar2 = *description;
  local_48 = __return_storage_ptr__;
  local_38 = param_names;
  local_90 = (String *)description;
  while (cVar2 != '\0') {
    bVar4 = SkipPrefix("%%",(char **)&local_90);
    description_00 = local_90;
    if (bVar4) {
      local_88._M_dataplus._M_p = (pointer)((long)&local_90[-1].length_ + 6);
      local_88._M_string_length = (size_type)local_90;
      local_88.field_2._M_allocated_capacity._0_4_ = 0xfffffffe;
      iVar3._M_current =
           (local_48->
           super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (local_48->
          super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
        ::_M_realloc_insert<testing::internal::Interpolation>
                  (local_48,iVar3,(Interpolation *)&local_88);
      }
      else {
        *(ulong *)&(iVar3._M_current)->param_index =
             CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,0xfffffffe);
        (iVar3._M_current)->start_pos = local_88._M_dataplus._M_p;
        (iVar3._M_current)->end_pos = (char *)local_90;
        ppIVar1 = &(local_48->
                   super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
    }
    else {
      bVar4 = SkipPrefix("%(",(char **)&local_90);
      description_00 = local_90;
      if (bVar4) {
        pcVar6 = strstr((char *)local_90,")s");
        if (pcVar6 == (char *)0x0) {
          Message::Message((Message *)&local_68);
          pcVar6 = (char *)((long)&description_00[-1].length_ + 6);
          FormatMatcherDescriptionSyntaxError_abi_cxx11_
                    (&local_88,(internal *)description,pcVar6,(char *)in_RCX);
          poVar8 = (ostream *)(local_68._M_dataplus._M_p + 0x10);
          if ((long *)local_68._M_dataplus._M_p == (long *)0x0) {
            poVar8 = (ostream *)0x0;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,local_88._M_dataplus._M_p,local_88._M_string_length);
          poVar8 = (ostream *)(local_68._M_dataplus._M_p + 0x10);
          if ((long *)local_68._M_dataplus._M_p == (long *)0x0) {
            poVar8 = (ostream *)0x0;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"an interpolation must end with \")s\", ",0x25);
          poVar8 = (ostream *)(local_68._M_dataplus._M_p + 0x10);
          if ((long *)local_68._M_dataplus._M_p == (long *)0x0) {
            poVar8 = (ostream *)0x0;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"but \"",5);
          poVar8 = (ostream *)(local_68._M_dataplus._M_p + 0x10);
          if ((long *)local_68._M_dataplus._M_p == (long *)0x0) {
            poVar8 = (ostream *)0x0;
          }
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar7);
          poVar8 = (ostream *)(local_68._M_dataplus._M_p + 0x10);
          if ((long *)local_68._M_dataplus._M_p == (long *)0x0) {
            poVar8 = (ostream *)0x0;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" does not.",0xb);
          in_RCX = (String *)0x2317;
          AssertHelper::AssertHelper
                    (&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                     ,0x2317,"Failed");
          AssertHelper::operator=(&local_98,(Message *)&local_68);
          AssertHelper::~AssertHelper(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
          }
        }
        else {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,description_00,pcVar6)
          ;
          iVar5 = GetParamIndex(local_38,&local_88);
          if (iVar5 == -3) {
            Message::Message((Message *)&local_98);
            FormatMatcherDescriptionSyntaxError_abi_cxx11_
                      (&local_68,(internal *)description,(char *)description_00,(char *)in_RCX);
            poVar8 = (ostream *)&(local_98.data_)->line;
            if (local_98.data_ == (AssertHelperData *)0x0) {
              poVar8 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,local_68._M_dataplus._M_p,local_68._M_string_length);
            poVar8 = (ostream *)&(local_98.data_)->line;
            if (local_98.data_ == (AssertHelperData *)0x0) {
              poVar8 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
            poVar8 = (ostream *)&(local_98.data_)->line;
            if (local_98.data_ == (AssertHelperData *)0x0) {
              poVar8 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,local_88._M_dataplus._M_p,local_88._M_string_length);
            poVar8 = (ostream *)&(local_98.data_)->line;
            if (local_98.data_ == (AssertHelperData *)0x0) {
              poVar8 = (ostream *)0x0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" is an invalid parameter name.",0x1f);
            in_RCX = (String *)0x231e;
            AssertHelper::AssertHelper
                      (&local_40,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                       ,0x231e,"Failed");
            AssertHelper::operator=(&local_40,(Message *)&local_98);
            AssertHelper::~AssertHelper(&local_40);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if (local_98.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_98.data_ + 8))();
            }
          }
          else {
            local_68._M_dataplus._M_p = (pointer)((long)&description_00[-1].length_ + 6);
            description_00 = (String *)(pcVar6 + 2);
            iVar3._M_current =
                 (local_48->
                 super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_68._M_string_length = (size_type)description_00;
            local_68.field_2._M_allocated_capacity._0_4_ = iVar5;
            if (iVar3._M_current ==
                (local_48->
                super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
              ::_M_realloc_insert<testing::internal::Interpolation>
                        (local_48,iVar3,(Interpolation *)&local_68);
              local_90 = description_00;
            }
            else {
              *(ulong *)&(iVar3._M_current)->param_index =
                   CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,iVar5);
              (iVar3._M_current)->start_pos = local_68._M_dataplus._M_p;
              (iVar3._M_current)->end_pos = (char *)description_00;
              ppIVar1 = &(local_48->
                         super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppIVar1 = *ppIVar1 + 1;
              local_90 = description_00;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
      }
      else {
        local_88._M_dataplus._M_p._0_1_ = 0x25;
        in_RCX = local_90;
        CmpHelperNE<char,char>
                  ((internal *)&local_68,"*p","\'%\'",(char *)local_90,(char *)&local_88);
        if ((char)local_68._M_dataplus._M_p == '\0') {
          Message::Message((Message *)&local_98);
          FormatMatcherDescriptionSyntaxError_abi_cxx11_
                    (&local_88,(internal *)description,(char *)description_00,(char *)in_RCX);
          poVar8 = (ostream *)&(local_98.data_)->line;
          if (local_98.data_ == (AssertHelperData *)0x0) {
            poVar8 = (ostream *)0x0;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,local_88._M_dataplus._M_p,local_88._M_string_length);
          poVar8 = (ostream *)&(local_98.data_)->line;
          if (local_98.data_ == (AssertHelperData *)0x0) {
            poVar8 = (ostream *)0x0;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"use \"%%\" instead of \"%\" to print \"%\".",0x25);
          pcVar6 = "";
          if (((String *)local_68._M_string_length != (String *)0x0) &&
             (pcVar6 = *(char **)local_68._M_string_length, pcVar6 == (char *)0x0)) {
            pcVar6 = "";
          }
          in_RCX = (String *)0x2327;
          AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                     ,8999,pcVar6);
          AssertHelper::operator=(&local_40,(Message *)&local_98);
          AssertHelper::~AssertHelper(&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          if (local_98.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_98.data_ + 8))();
          }
        }
        scoped_ptr<testing::internal::String>::reset
                  ((scoped_ptr<testing::internal::String> *)&local_68._M_string_length,(String *)0x0
                  );
        description_00 = (String *)((long)&description_00->c_str_ + 1);
        local_90 = description_00;
      }
    }
    cVar2 = *(char *)&description_00->c_str_;
  }
  return local_48;
}

Assistant:

Interpolations ValidateMatcherDescription(
    const char* param_names[], const char* description) {
  Interpolations interps;
  for (const char* p = description; *p != '\0';) {
    if (SkipPrefix("%%", &p)) {
      interps.push_back(Interpolation(p - 2, p, kPercentInterpolation));
    } else if (SkipPrefix("%(", &p)) {
      const char* const q = strstr(p, ")s");
      if (q == NULL) {
        // TODO(wan@google.com): change the source file location in
        // the failure to point to where the MATCHER*() macro is used.
        ADD_FAILURE() << FormatMatcherDescriptionSyntaxError(description, p - 2)
                      << "an interpolation must end with \")s\", "
                      << "but \"" << (p - 2) << "\" does not.";
      } else {
        const string param_name(p, q);
        const int param_index = GetParamIndex(param_names, param_name);
        if (param_index == kInvalidInterpolation) {
          ADD_FAILURE() << FormatMatcherDescriptionSyntaxError(description, p)
                        << "\"" << param_name
                        << "\" is an invalid parameter name.";
        } else {
          interps.push_back(Interpolation(p - 2, q + 2, param_index));
          p = q + 2;
        }
      }
    } else {
      EXPECT_NE(*p, '%') << FormatMatcherDescriptionSyntaxError(description, p)
                         << "use \"%%\" instead of \"%\" to print \"%\".";
      ++p;
    }
  }
  return interps;
}